

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_numbers.c
# Opt level: O1

FIOBJ fiobj_num_new_bignum(intptr_t num)

{
  undefined1 *puVar1;
  long lVar2;
  long *in_FS_OFFSET;
  
  lVar2 = 0x10;
  puVar1 = (undefined1 *)fio_malloc(0x10);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 1;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(intptr_t *)(puVar1 + 8) = num;
    return (FIOBJ)puVar1;
  }
  fiobj_num_new_bignum_cold_1();
  *(undefined1 *)(in_FS_OFFSET + -0x50) = 1;
  *(undefined4 *)((long)in_FS_OFFSET + -0x27c) = 0xfffffff;
  in_FS_OFFSET[-0x4f] = lVar2;
  return *in_FS_OFFSET - 0x280;
}

Assistant:

FIOBJ fiobj_num_new_bignum(intptr_t num) {
  fiobj_num_s *o = fio_malloc(sizeof(*o));
  if (!o) {
    perror("ERROR: fiobj number couldn't allocate memory");
    exit(errno);
  }
  *o = (fiobj_num_s){
      .head =
          {
              .type = FIOBJ_T_NUMBER,
              .ref = 1,
          },
      .i = num,
  };
  return (FIOBJ)o;
}